

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  ImGuiID *pIVar2;
  ImVec2 IVar3;
  ImGuiID IVar4;
  ImGuiWindow *window;
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  float fVar6;
  float fVar7;
  ImVec2 pos;
  ImVec2 local_10;
  
  pIVar5 = GImGui;
  window_00 = GImGui->MovingWindow;
  if (window_00 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar4 = GImGui->ActiveIdWindow->MoveId;
    if (IVar4 != GImGui->ActiveId) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar4;
    if (pIVar5->ActiveIdPreviousFrame == IVar4) {
      pIVar5->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar5->IO).MouseDown[0] != false) {
      return;
    }
    SetActiveID(0,(ImGuiWindow *)0x0);
    return;
  }
  pIVar1 = &GImGui->ActiveId;
  pIVar2 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar1;
  if (*pIVar2 == *pIVar1) {
    pIVar5->ActiveIdPreviousFrameIsAlive = true;
  }
  if ((pIVar5->IO).MouseDown[0] != true) {
LAB_0011eba5:
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar3 = (pIVar5->IO).MousePos;
  fVar6 = IVar3.x;
  if ((fVar6 < -256000.0) || (fVar7 = IVar3.y, fVar7 < -256000.0)) goto LAB_0011eba5;
  window = window_00->RootWindow;
  local_10.x = fVar6 - (pIVar5->ActiveIdClickOffset).x;
  local_10.y = fVar7 - (pIVar5->ActiveIdClickOffset).y;
  fVar6 = (window->Pos).x;
  if ((fVar6 == local_10.x) && (!NAN(fVar6) && !NAN(local_10.x))) {
    fVar6 = (window->Pos).y;
    if ((fVar6 == local_10.y) && (!NAN(fVar6) && !NAN(local_10.y))) goto LAB_0011eb9e;
  }
  if (((window->Flags & 0x100) == 0) && (pIVar5->SettingsDirtyTimer <= 0.0)) {
    pIVar5->SettingsDirtyTimer = (pIVar5->IO).IniSavingRate;
  }
  SetWindowPos(window,&local_10,1);
  window_00 = pIVar5->MovingWindow;
LAB_0011eb9e:
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}